

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnWriter::Analyze
          (ColumnWriter *this,ColumnWriterState *state,ColumnWriterState *parent,Vector *vector,
          idx_t count)

{
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Writer does not need analysis",&local_39);
  NotImplementedException::NotImplementedException(this_00,&local_38);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

virtual void Analyze(ColumnWriterState &state, ColumnWriterState *parent, Vector &vector, idx_t count) {
		throw NotImplementedException("Writer does not need analysis");
	}